

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_lite.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::ImmutableMessageLiteGenerator::GenerateParser
          (ImmutableMessageLiteGenerator *this,Printer *printer)

{
  io::Printer::Print<char[10],std::__cxx11::string>
            (printer,
             "private static volatile com.google.protobuf.Parser<$classname$> PARSER;\n\npublic static com.google.protobuf.Parser<$classname$> parser() {\n  return DEFAULT_INSTANCE.getParserForType();\n}\n"
             ,(char (*) [10])0x3dd2a7,
             *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
              ((this->super_MessageGenerator).descriptor_ + 8));
  return;
}

Assistant:

void ImmutableMessageLiteGenerator::GenerateParser(io::Printer* printer) {
  printer->Print(
      "private static volatile com.google.protobuf.Parser<$classname$> "
      "PARSER;\n"
      "\n"
      "public static com.google.protobuf.Parser<$classname$> parser() {\n"
      "  return DEFAULT_INSTANCE.getParserForType();\n"
      "}\n",
      "classname", descriptor_->name());
}